

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_bf7da7::HandleCreateLinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  CopyStatus CVar1;
  CopyStatus CVar2;
  const_reference pvVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  size_type sVar8;
  cmArgumentParser<Arguments> *pcVar9;
  reference __rhs;
  ulong uVar10;
  cmMakefile *pcVar11;
  static_string_view sVar12;
  string_view sVar13;
  byte local_43a;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  CopyStatus local_350;
  CopyStatus local_340;
  Status local_330;
  Status copied;
  string local_308;
  Status local_2e8;
  Status linked_1;
  string local_2c0;
  Status local_29c;
  Status linked;
  bool completed;
  char local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string_view local_1e0;
  undefined1 local_1d0 [8];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_168;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_158;
  undefined1 local_148 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmArgumentParser<Arguments> local_d8;
  const_reference local_68;
  string *newFileName;
  string *fileName;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar4 = local_20;
  if (sVar8 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "CREATE_LINK must be called with at least two additional arguments",&local_41);
    cmExecutionStatus::SetError(pcVar4,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_0067e673;
  }
  newFileName = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)status_local,1);
  local_68 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
  if (((anonymous_namespace)::
       HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar7 != 0)) {
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_d8.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_d8.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_d8);
    sVar12 = ::cm::operator____s("RESULT",6);
    pcVar9 = cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::Bind<std::__cxx11::string>
                       ((cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                         *)&local_d8,sVar12,0);
    sVar12 = ::cm::operator____s("COPY_ON_ERROR",0xd);
    pcVar9 = cmArgumentParser<Arguments>::Bind<bool>(pcVar9,sVar12,0x20);
    sVar12 = ::cm::operator____s("SYMBOLIC",8);
    pcVar9 = cmArgumentParser<Arguments>::Bind<bool>(pcVar9,sVar12,0x21);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleCreateLinkCommand::parser,pcVar9);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_d8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCreateLinkCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arguments.CopyOnError);
  local_168 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)status_local);
  local_158 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_168,3);
  cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_148,
             (cmArgumentParser<(anonymous_namespace)::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&HandleCreateLinkCommand::parser,&local_158,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&arguments.CopyOnError,0);
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments.CopyOnError);
  pcVar4 = local_20;
  if (bVar5) {
    std::__cxx11::string::string((string *)local_1d0);
    _Var6 = std::operator==(newFileName,local_68);
    if (_Var6) {
      std::__cxx11::string::operator=
                ((string *)local_1d0,"CREATE_LINK cannot use same file and newfile");
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        pcVar11 = cmExecutionStatus::GetMakefile(local_20);
        local_1e0 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d0);
        cmMakefile::AddDefinition(pcVar11,(string *)local_148,local_1e0);
        args_local._7_1_ = 1;
        result.field_2._12_4_ = 1;
      }
      else {
        cmExecutionStatus::SetError(local_20,(string *)local_1d0);
        args_local._7_1_ = 0;
        result.field_2._12_4_ = 1;
      }
    }
    else {
      if ((arguments.Result.field_2._M_local_buf[9] & 1U) == 0) {
        bVar5 = cmsys::SystemTools::FileExists(newFileName);
        if (!bVar5) {
          std::operator+(&local_220,"Cannot hard link \'",newFileName);
          std::operator+(&local_200,&local_220,"\' as it does not exist.");
          std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_220);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pcVar11 = cmExecutionStatus::GetMakefile(local_20);
            sVar13 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d0);
            cmMakefile::AddDefinition(pcVar11,(string *)local_148,sVar13);
            args_local._7_1_ = 1;
            result.field_2._12_4_ = 1;
          }
          else {
            cmExecutionStatus::SetError(local_20,(string *)local_1d0);
            args_local._7_1_ = 0;
            result.field_2._12_4_ = 1;
          }
          goto LAB_0067e623;
        }
      }
      bVar5 = cmsys::SystemTools::PathExists(local_68);
      local_43a = 0;
      if (bVar5) {
        err.field_2._8_8_ = cmsys::SystemTools::RemoveFile(local_68);
        bVar5 = cmsys::Status::operator_cast_to_bool((Status *)((long)&err.field_2 + 8));
        local_43a = bVar5 ^ 0xff;
      }
      pvVar3 = local_68;
      if ((local_43a & 1) == 0) {
        linked.Kind_._3_1_ = Success >> 0x18;
        if ((arguments.Result.field_2._M_local_buf[9] & 1U) == 0) {
          local_2e8 = cmSystemTools::CreateLinkQuietly(newFileName,local_68);
          bVar5 = cmsys::Status::operator_cast_to_bool(&local_2e8);
          pvVar3 = local_68;
          if (bVar5) {
            linked.Kind_._3_1_ = 1;
          }
          else {
            cmsys::Status::GetString_abi_cxx11_((string *)&copied,&local_2e8);
            cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                      (&local_308,(char (*) [24])"failed to create link \'",pvVar3,
                       (char (*) [4])0x114ebd5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copied)
            ;
            std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&copied);
          }
        }
        else {
          local_29c = cmSystemTools::CreateSymlinkQuietly(newFileName,local_68);
          bVar5 = cmsys::Status::operator_cast_to_bool(&local_29c);
          pvVar3 = local_68;
          if (bVar5) {
            linked.Kind_._3_1_ = 1;
          }
          else {
            cmsys::Status::GetString_abi_cxx11_((string *)&linked_1,&local_29c);
            cmStrCat<char_const(&)[33],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
                      (&local_2c0,(char (*) [33])"failed to create symbolic link \'",pvVar3,
                       (char (*) [4])0x114ebd5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &linked_1);
            std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_2c0);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::__cxx11::string::~string((string *)&linked_1);
          }
        }
        CVar2.Path = local_340.Path;
        CVar2.super_Status = local_340.super_Status;
        CVar1.Path = local_350.Path;
        CVar1.super_Status = local_350.super_Status;
        if (((linked.Kind_._3_1_ & 1) == Success >> 0x18) &&
           (local_350 = CVar1, local_340 = CVar2,
           (arguments.Result.field_2._M_local_buf[8] & 1U) != 0)) {
          local_350 = cmsys::SystemTools::CopyFileAlways(newFileName,local_68);
          local_330 = local_350.super_Status;
          local_340 = local_350;
          bVar5 = cmsys::Status::operator_cast_to_bool(&local_330);
          if (bVar5) {
            linked.Kind_._3_1_ = 1;
          }
          else {
            cmsys::Status::GetString_abi_cxx11_(&local_390,&local_330);
            std::operator+(&local_370,"Copy failed: ",&local_390);
            std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_370);
            std::__cxx11::string::~string((string *)&local_370);
            std::__cxx11::string::~string((string *)&local_390);
          }
        }
        if ((linked.Kind_._3_1_ & 1) == Success >> 0x18) {
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) != 0) {
            cmExecutionStatus::SetError(local_20,(string *)local_1d0);
            args_local._7_1_ = 0;
            result.field_2._12_4_ = 1;
            goto LAB_0067e623;
          }
        }
        else {
          std::__cxx11::string::operator=((string *)local_1d0,"0");
        }
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar11 = cmExecutionStatus::GetMakefile(local_20);
          sVar13 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d0);
          cmMakefile::AddDefinition(pcVar11,(string *)local_148,sVar13);
        }
        args_local._7_1_ = 1;
        result.field_2._12_4_ = 1;
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        local_279 = '\n';
        cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[44],std::__cxx11::string,char>
                  ((string *)local_258,(char (*) [24])"Failed to create link \'",pvVar3,
                   (char (*) [44])"\' because existing path cannot be removed: ",&local_278,
                   &local_279);
        std::__cxx11::string::~string((string *)&local_278);
        uVar10 = std::__cxx11::string::empty();
        bVar5 = (uVar10 & 1) != 0;
        if (bVar5) {
          cmExecutionStatus::SetError(local_20,(string *)local_258);
        }
        else {
          pcVar11 = cmExecutionStatus::GetMakefile(local_20);
          sVar13 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_258);
          register0x00000000 = sVar13._M_len;
          cmMakefile::AddDefinition(pcVar11,(string *)local_148,sVar13);
        }
        args_local._7_1_ = !bVar5;
        result.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_258);
      }
    }
LAB_0067e623:
    std::__cxx11::string::~string((string *)local_1d0);
  }
  else {
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&arguments.CopyOnError);
    std::operator+(&local_1a8,"unknown argument: \"",__rhs);
    std::operator+(&local_188,&local_1a8,'\"');
    cmExecutionStatus::SetError(pcVar4,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    args_local._7_1_ = 0;
    result.field_2._12_4_ = 1;
  }
  HandleCreateLinkCommand::Arguments::~Arguments((Arguments *)local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.CopyOnError);
LAB_0067e673:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleCreateLinkCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("CREATE_LINK must be called with at least two additional "
                    "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    status.SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, result);
      return true;
    }
    status.SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if (cmSystemTools::PathExists(newFileName) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    auto err = cmStrCat("Failed to create link '", newFileName,
                        "' because existing path cannot be removed: ",
                        cmSystemTools::GetLastSystemError(), '\n');

    if (!arguments.Result.empty()) {
      status.GetMakefile().AddDefinition(arguments.Result, err);
      return true;
    }
    status.SetError(err);
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    cmsys::Status linked =
      cmSystemTools::CreateSymlinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create symbolic link '", newFileName,
                        "': ", linked.GetString());
    }
  } else {
    cmsys::Status linked =
      cmSystemTools::CreateLinkQuietly(fileName, newFileName);
    if (linked) {
      completed = true;
    } else {
      result = cmStrCat("failed to create link '", newFileName,
                        "': ", linked.GetString());
    }
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    cmsys::Status copied =
      cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (copied) {
      completed = true;
    } else {
      result = "Copy failed: " + copied.GetString();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    status.SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    status.GetMakefile().AddDefinition(arguments.Result, result);
  }

  return true;
}